

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::DuplicateNameChecker::visit(DuplicateNameChecker *this,Function *f)

{
  pointer ppVar1;
  pointer ppVar2;
  Identifier nameToCheck;
  Block *pBVar3;
  VariableDeclaration *pVVar4;
  pool_ref<soul::AST::Statement> *s;
  pointer ppVar5;
  pool_ref<soul::AST::VariableDeclaration> *param;
  pointer ppVar6;
  pool_ptr<soul::AST::VariableDeclaration> v;
  DuplicateNameChecker duplicateNameChecker;
  pool_ref<soul::AST::Statement> local_58;
  long local_50;
  DuplicateNameChecker local_48;
  
  ASTVisitor::visit(&this->super_ASTVisitor,f);
  local_48.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (f->parameters).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (f->parameters).
                super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1; ppVar6 = ppVar6 + 1) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_48,(ppVar6->object->name).name,
               &(ppVar6->object->super_Statement).super_ASTObject.context);
  }
  if ((f->block).object != (Block *)0x0) {
    pBVar3 = pool_ptr<soul::AST::Block>::operator->(&f->block);
    ppVar2 = (pBVar3->statements).
             super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = (pBVar3->statements).
                  super__Vector_base<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1)
    {
      local_58.object = ppVar5->object;
      cast<soul::AST::VariableDeclaration,soul::AST::Statement>((soul *)&local_50,&local_58);
      if (local_50 != 0) {
        pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                           ((pool_ptr<soul::AST::VariableDeclaration> *)&local_50);
        nameToCheck.name = (pVVar4->name).name;
        pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                           ((pool_ptr<soul::AST::VariableDeclaration> *)&local_50);
        soul::DuplicateNameChecker::check<soul::AST::Context&>
                  (&local_48,nameToCheck,&(pVVar4->super_Statement).super_ASTObject.context);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48.names);
  return;
}

Assistant:

void visit (AST::Function& f) override
        {
            super::visit (f);
            soul::DuplicateNameChecker duplicateNameChecker;

            for (auto& param : f.parameters)
                duplicateNameChecker.check (param->name, param->context);

            if (f.block != nullptr)
            {
                // Ensure top level block variables do not duplicate parameter names
                for (auto& s : f.block->statements)
                    if (auto v = cast<AST::VariableDeclaration> (s))
                        duplicateNameChecker.check (v->name, v->context);
            }
        }